

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O3

void chatra::structureInnerNode
               (IErrorReceiver *errorReceiver,shared_ptr<chatra::StringTable> *sTable,Node *node,
               bool recursive)

{
  vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_> *this;
  pointer pbVar1;
  element_type *peVar2;
  element_type *peVar3;
  pointer ppTVar4;
  undefined1 *puVar5;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  Node *pNVar6;
  pointer psVar7;
  char cVar8;
  char cVar9;
  Token *pTVar10;
  Token *pTVar11;
  Token *token;
  const_iterator cVar12;
  iterator iVar13;
  __normal_iterator<const_std::shared_ptr<chatra::Node>_*,_std::vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>_>
  __x;
  __normal_iterator<const_chatra::NodeType_*,_std::vector<chatra::NodeType,_std::allocator<chatra::NodeType>_>_>
  _Var14;
  undefined8 *puVar15;
  long *plVar16;
  const_iterator cVar17;
  iterator iVar18;
  undefined1 auVar19 [8];
  shared_ptr<chatra::Node> *psVar20;
  NodeType NVar21;
  undefined7 in_register_00000009;
  long lVar22;
  size_type *psVar23;
  iterator iVar24;
  bool bVar25;
  uint uVar26;
  uint uVar27;
  ulong uVar28;
  iterator __last;
  bool bVar29;
  shared_ptr<chatra::Node> *n_1;
  long lVar30;
  pointer psVar31;
  __normal_iterator<const_std::shared_ptr<chatra::Node>_*,_std::vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>_>
  last;
  pointer pbVar32;
  string *__str_1;
  shared_ptr<chatra::Node> *n;
  __normal_iterator<const_std::shared_ptr<chatra::Node>_*,_std::vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>_>
  first;
  undefined1 auVar33 [8];
  bool bVar34;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_178;
  Token *local_158;
  __normal_iterator<const_std::shared_ptr<chatra::Node>_*,_std::vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>_>
  local_150;
  const_iterator itForward;
  size_t tokenIndex;
  pointer *local_128;
  long local_120;
  pointer local_118 [2];
  undefined1 local_108 [32];
  undefined1 local_e8 [8];
  ParserContext ct;
  undefined1 auStack_c8 [8];
  vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_> outNodes;
  undefined1 auStack_a8 [8];
  string __str;
  uint local_80;
  undefined1 local_78 [28];
  uint local_5c;
  string local_58;
  Node *local_38;
  
  ct.sTable._4_4_ = (undefined4)CONCAT71(in_register_00000009,recursive);
  local_e8 = (undefined1  [8])0x0;
  peVar2 = (node->line).super___shared_ptr<chatra::Line,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (peVar2 == (element_type *)0x0) {
    local_5c = 0;
  }
  else {
    local_5c = peVar2->indents + 1;
  }
  auStack_c8 = (undefined1  [8])0x0;
  outNodes.
  super__Vector_base<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  outNodes.
  super__Vector_base<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  first._M_current =
       (node->blockNodes).
       super__Vector_base<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  last._M_current =
       (node->blockNodes).
       super__Vector_base<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  ct.ws = (ParserWorkingSet *)errorReceiver;
  ct.errorReceiver = (IErrorReceiver *)sTable;
  local_38 = node;
  if (first._M_current != last._M_current) {
    do {
      peVar2 = ((((first._M_current)->super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>).
                _M_ptr)->line).super___shared_ptr<chatra::Line,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      pTVar10 = (peVar2->tokens).super__Vector_base<chatra::Token,_std::allocator<chatra::Token>_>.
                _M_impl.super__Vector_impl_data._M_start;
      if (peVar2->indents != local_5c) {
        local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_58,
                   "indent mismatch. Expected ${0} indents but ${1} indents found","");
        cVar9 = '\x01';
        if (local_5c < 10) goto LAB_001856c5;
        uVar26 = local_5c;
        cVar8 = '\x04';
        goto LAB_0018568d;
      }
      if (pTVar10->type == Name) {
        itForward._M_current = (shared_ptr<chatra::Node> *)0x0;
        local_150._M_current = first._M_current;
        pTVar10 = nextTokenFromNodes<__gnu_cxx::__normal_iterator<std::shared_ptr<chatra::Node>const*,std::vector<std::shared_ptr<chatra::Node>,std::allocator<std::shared_ptr<chatra::Node>>>>>
                            (first,last,&local_150,(size_t *)&itForward);
        pNVar6 = local_38;
        pTVar11 = nextTokenFromNodes<__gnu_cxx::__normal_iterator<std::shared_ptr<chatra::Node>const*,std::vector<std::shared_ptr<chatra::Node>,std::allocator<std::shared_ptr<chatra::Node>>>>>
                            (first,(local_38->blockNodes).
                                   super__Vector_base<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish,&local_150,
                             (size_t *)&itForward);
        token = nextTokenFromNodes<__gnu_cxx::__normal_iterator<std::shared_ptr<chatra::Node>const*,std::vector<std::shared_ptr<chatra::Node>,std::allocator<std::shared_ptr<chatra::Node>>>>>
                          (first,(pNVar6->blockNodes).
                                 super__Vector_base<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
                                 ._M_impl.super__Vector_impl_data._M_finish,&local_150,
                           (size_t *)&itForward);
        outNodes.
        super__Vector_base<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = Invalid;
        if (token != (Token *)0x0) {
          cVar12 = std::
                   _Hashtable<chatra::StringId,_std::pair<const_chatra::StringId,_chatra::LineAttributes>,_std::allocator<std::pair<const_chatra::StringId,_chatra::LineAttributes>_>,_std::__detail::_Select1st,_std::equal_to<chatra::StringId>,_std::hash<chatra::StringId>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                   ::find((_Hashtable<chatra::StringId,_std::pair<const_chatra::StringId,_chatra::LineAttributes>,_std::allocator<std::pair<const_chatra::StringId,_chatra::LineAttributes>_>,_std::__detail::_Select1st,_std::equal_to<chatra::StringId>,_std::hash<chatra::StringId>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                           *)lineTypes,&pTVar10->sid);
          if (((cVar12.
                super__Node_iterator_base<std::pair<const_chatra::StringId,_chatra::LineAttributes>,_false>
                ._M_cur == (__node_type *)0x0) && (pTVar11->sid == Colon)) && (token->type == Name))
          {
            outNodes.
            super__Vector_base<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = pTVar10->sid;
            pTVar10 = token;
          }
        }
        local_158 = pTVar10;
        iVar13 = std::
                 _Hashtable<chatra::StringId,_std::pair<const_chatra::StringId,_chatra::LineAttributes>,_std::allocator<std::pair<const_chatra::StringId,_chatra::LineAttributes>_>,_std::__detail::_Select1st,_std::equal_to<chatra::StringId>,_std::hash<chatra::StringId>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                 ::find((_Hashtable<chatra::StringId,_std::pair<const_chatra::StringId,_chatra::LineAttributes>,_std::allocator<std::pair<const_chatra::StringId,_chatra::LineAttributes>_>,_std::__detail::_Select1st,_std::equal_to<chatra::StringId>,_std::hash<chatra::StringId>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                         *)lineTypes,&pTVar10->sid);
        if (iVar13.
            super__Node_iterator_base<std::pair<const_chatra::StringId,_chatra::LineAttributes>,_false>
            ._M_cur == (__node_type *)0x0) {
          last._M_current =
               (local_38->blockNodes).
               super__Vector_base<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
          goto LAB_0018520a;
        }
        __x = combineWrappedLines<__gnu_cxx::__normal_iterator<std::shared_ptr<chatra::Node>const*,std::vector<std::shared_ptr<chatra::Node>,std::allocator<std::shared_ptr<chatra::Node>>>>>
                        (first,(local_38->blockNodes).
                               super__Vector_base<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish,
                         *(bool *)((long)iVar13.
                                         super__Node_iterator_base<std::pair<const_chatra::StringId,_chatra::LineAttributes>,_false>
                                         ._M_cur + 0x11));
        if ((token == (Token *)0x0) ||
           (outNodes.
            super__Vector_base<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ == Invalid)) {
LAB_001852fb:
          _Var14 = std::
                   __find_if<__gnu_cxx::__normal_iterator<chatra::NodeType_const*,std::vector<chatra::NodeType,std::allocator<chatra::NodeType>>>,__gnu_cxx::__ops::_Iter_equals_val<chatra::NodeType_const>>
                             (*(undefined8 *)
                               ((long)iVar13.
                                      super__Node_iterator_base<std::pair<const_chatra::StringId,_chatra::LineAttributes>,_false>
                                      ._M_cur + 0x18),
                              *(undefined8 *)
                               ((long)iVar13.
                                      super__Node_iterator_base<std::pair<const_chatra::StringId,_chatra::LineAttributes>,_false>
                                      ._M_cur + 0x20),local_38);
          if (_Var14._M_current ==
              *(NodeType **)
               ((long)iVar13.
                      super__Node_iterator_base<std::pair<const_chatra::StringId,_chatra::LineAttributes>,_false>
                      ._M_cur + 0x20)) {
            local_108._0_8_ = local_108 + 0x10;
            std::__cxx11::string::_M_construct<char_const*>((string *)local_108,"statement \"","");
            lVar22 = (ulong)pTVar10->sid * 0x20;
            local_128 = local_118;
            lVar30 = *(long *)((ct.errorReceiver)->_vptr_IErrorReceiver[8] + lVar22);
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_128,lVar30,
                       *(long *)((ct.errorReceiver)->_vptr_IErrorReceiver[8] + lVar22 + 8) + lVar30)
            ;
            pbVar32 = (pointer)0xf;
            if ((pointer)local_108._0_8_ != (pointer)(local_108 + 0x10)) {
              pbVar32 = (pointer)local_108._16_8_;
            }
            pbVar1 = (pointer)((long)&((_Alloc_hider *)local_108._8_8_)->_M_p + local_120);
            if (pbVar32 < pbVar1) {
              pbVar32 = (pointer)0xf;
              if (local_128 != local_118) {
                pbVar32 = local_118[0];
              }
              if (pbVar32 < pbVar1) goto LAB_0018541f;
              puVar15 = (undefined8 *)
                        std::__cxx11::string::replace
                                  ((ulong)&local_128,0,(char *)0x0,local_108._0_8_);
            }
            else {
LAB_0018541f:
              puVar15 = (undefined8 *)std::__cxx11::string::_M_append(local_108,(ulong)local_128);
            }
            psVar23 = puVar15 + 2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*puVar15 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar23) {
              local_58.field_2._M_allocated_capacity = *psVar23;
              local_58.field_2._8_8_ = puVar15[3];
              local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
            }
            else {
              local_58.field_2._M_allocated_capacity = *psVar23;
              local_58._M_dataplus._M_p = (pointer)*puVar15;
            }
            local_58._M_string_length = puVar15[1];
            *puVar15 = psVar23;
            puVar15[1] = 0;
            *(undefined1 *)psVar23 = 0;
            plVar16 = (long *)std::__cxx11::string::append((char *)&local_58);
            psVar23 = (size_type *)(plVar16 + 2);
            if ((size_type *)*plVar16 == psVar23) {
              __str._M_string_length = *psVar23;
              __str.field_2._M_allocated_capacity = plVar16[3];
              auStack_a8 = (undefined1  [8])&__str._M_string_length;
            }
            else {
              __str._M_string_length = *psVar23;
              auStack_a8 = (undefined1  [8])*plVar16;
            }
            __str._M_dataplus._M_p = (pointer)plVar16[1];
            *plVar16 = (long)psVar23;
            plVar16[1] = 0;
            *(undefined1 *)(plVar16 + 2) = 0;
            local_178.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            local_178.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            local_178.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            ParserContext::errorAtToken
                      ((ParserContext *)local_e8,Error,local_158,(string *)auStack_a8,&local_178);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector(&local_178);
            if (auStack_a8 != (undefined1  [8])&__str._M_string_length) {
              operator_delete((void *)auStack_a8);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_58._M_dataplus._M_p != &local_58.field_2) {
              operator_delete(local_58._M_dataplus._M_p);
            }
            if (local_128 != local_118) {
              operator_delete(local_128);
            }
            auVar19 = (undefined1  [8])local_108._0_8_;
            if ((pointer)local_108._0_8_ != (pointer)(local_108 + 0x10)) goto LAB_001852d9;
          }
          else {
            NVar21 = *(NodeType *)
                      ((long)iVar13.
                             super__Node_iterator_base<std::pair<const_chatra::StringId,_chatra::LineAttributes>,_false>
                             ._M_cur + 0x10);
            peVar3 = ((first._M_current)->
                     super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
            peVar3->type = NVar21;
            if ((pTVar11 == (Token *)0x0) || (NVar21 != Def)) {
              if ((pTVar11 != (Token *)0x0) &&
                 ((NVar21 == Else && (NVar21 = ElseIf, pTVar11->sid == If)))) goto LAB_00185449;
            }
            else {
              NVar21 = DefOperator;
              if (pTVar11->sid == Operator) {
LAB_00185449:
                peVar3->type = NVar21;
              }
            }
            if (*(char *)((long)iVar13.
                                super__Node_iterator_base<std::pair<const_chatra::StringId,_chatra::LineAttributes>,_false>
                                ._M_cur + 0x11) == '\x01') {
              while ((__x._M_current !=
                      (local_38->blockNodes).
                      super__Vector_base<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish &&
                     (local_5c <
                      (((((__x._M_current)->
                         super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->line
                       ).super___shared_ptr<chatra::Line,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                      indents))) {
                std::
                vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
                ::push_back(&(((first._M_current)->
                              super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)
                             ->blockNodes,__x._M_current);
                __x._M_current = __x._M_current + 1;
              }
            }
            std::
            vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>::
            push_back((vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
                       *)auStack_c8,first._M_current);
          }
        }
        else {
          peVar3 = ((first._M_current)->super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>
                   )._M_ptr;
          ppTVar4 = (peVar3->tokens).
                    super__Vector_base<const_chatra::Token_*,_std::allocator<const_chatra::Token_*>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          if (((ulong)((long)(peVar3->tokens).
                             super__Vector_base<const_chatra::Token_*,_std::allocator<const_chatra::Token_*>_>
                             ._M_impl.super__Vector_impl_data._M_finish - (long)ppTVar4) < 0x11) ||
             (token != ppTVar4[2])) {
            auStack_a8 = (undefined1  [8])&__str._M_string_length;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)auStack_a8,
                       "this line seems to be part of wrapping line, but indents may be incorrect",
                       "");
            local_58._M_dataplus._M_p = (pointer)0x0;
            local_58._M_string_length = 0;
            local_58.field_2._M_allocated_capacity = 0;
            ParserContext::errorAtToken
                      ((ParserContext *)local_e8,Error,token,(string *)auStack_a8,
                       (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)&local_58);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&local_58);
            if (auStack_a8 != (undefined1  [8])&__str._M_string_length) {
              operator_delete((void *)auStack_a8);
            }
            __x._M_current =
                 local_150._M_current +
                 (itForward._M_current != (shared_ptr<chatra::Node> *)0x0 &&
                 local_150._M_current !=
                 (local_38->blockNodes).
                 super__Vector_base<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish);
            goto LAB_0018548f;
          }
          if ((*(byte *)((long)iVar13.
                               super__Node_iterator_base<std::pair<const_chatra::StringId,_chatra::LineAttributes>,_false>
                               ._M_cur + 0x10) & 0xfe) == 0xe) {
            peVar3->sid = outNodes.
                          super__Vector_base<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_;
            goto LAB_001852fb;
          }
          auStack_a8 = (undefined1  [8])&__str._M_string_length;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)auStack_a8,"only \"for\" or \"while\" can take label","");
          local_58._M_dataplus._M_p = (pointer)0x0;
          local_58._M_string_length = 0;
          local_58.field_2._M_allocated_capacity = 0;
          ParserContext::errorAtToken
                    ((ParserContext *)local_e8,Error,token,(string *)auStack_a8,
                     (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&local_58);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&local_58);
          auVar19 = auStack_a8;
          if (auStack_a8 == (undefined1  [8])&__str._M_string_length) goto LAB_0018548f;
LAB_001852d9:
          operator_delete((void *)auVar19);
        }
      }
      else {
LAB_0018520a:
        __x = combineWrappedLines<__gnu_cxx::__normal_iterator<std::shared_ptr<chatra::Node>const*,std::vector<std::shared_ptr<chatra::Node>,std::allocator<std::shared_ptr<chatra::Node>>>>>
                        (first,last,false);
        _Var14 = std::
                 __find_if<__gnu_cxx::__normal_iterator<chatra::NodeType_const*,std::vector<chatra::NodeType,std::allocator<chatra::NodeType>>>,__gnu_cxx::__ops::_Iter_equals_val<chatra::NodeType_const>>
                           (expressionParentType,DAT_00255468,local_38);
        peVar3 = ((first._M_current)->super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>).
                 _M_ptr;
        if (_Var14._M_current == DAT_00255468) {
          auStack_a8 = (undefined1  [8])&__str._M_string_length;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)auStack_a8,"expression is not allowed here","");
          local_58._M_dataplus._M_p = (pointer)0x0;
          local_58._M_string_length = 0;
          local_58.field_2._M_allocated_capacity = 0;
          peVar2 = (peVar3->line).super___shared_ptr<chatra::Line,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr;
          (**(code **)(*(long *)ct.ws + 0x10))
                    (ct.ws,2,&peVar2->fileName,peVar2->lineNo,&peVar2->line,0xffffffffffffffff,
                     0xffffffffffffffff,(string *)auStack_a8,&local_58);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&local_58);
          auVar19 = auStack_a8;
          if (auStack_a8 != (undefined1  [8])&__str._M_string_length) goto LAB_001852d9;
        }
        else {
          peVar3->type = Expression;
          std::
          vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>::
          push_back((vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
                     *)auStack_c8,first._M_current);
        }
      }
LAB_0018548f:
      last._M_current =
           (local_38->blockNodes).
           super__Vector_base<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      first._M_current = __x._M_current;
    } while (__x._M_current != last._M_current);
  }
  goto LAB_00185820;
  while( true ) {
    if (uVar26 < 10000) goto LAB_001856c5;
    bVar34 = uVar26 < 100000;
    uVar26 = uVar26 / 10000;
    cVar8 = cVar9 + '\x04';
    if (bVar34) break;
LAB_0018568d:
    cVar9 = cVar8;
    if (uVar26 < 100) {
      cVar9 = cVar9 + -2;
      goto LAB_001856c5;
    }
    if (uVar26 < 1000) {
      cVar9 = cVar9 + -1;
      goto LAB_001856c5;
    }
  }
  cVar9 = cVar9 + '\x01';
LAB_001856c5:
  auStack_a8 = (undefined1  [8])&__str._M_string_length;
  std::__cxx11::string::_M_construct((ulong)auStack_a8,cVar9);
  std::__detail::__to_chars_10_impl<unsigned_int>
            ((char *)auStack_a8,(uint)__str._M_dataplus._M_p,local_5c);
  uVar26 = (((((first._M_current)->super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>).
             _M_ptr)->line).super___shared_ptr<chatra::Line,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
           indents;
  cVar9 = '\x01';
  if (9 < uVar26) {
    uVar27 = uVar26;
    cVar8 = '\x04';
    do {
      cVar9 = cVar8;
      if (uVar27 < 100) {
        cVar9 = cVar9 + -2;
        goto LAB_00185746;
      }
      if (uVar27 < 1000) {
        cVar9 = cVar9 + -1;
        goto LAB_00185746;
      }
      if (uVar27 < 10000) goto LAB_00185746;
      bVar34 = 99999 < uVar27;
      uVar27 = uVar27 / 10000;
      cVar8 = cVar9 + '\x04';
    } while (bVar34);
    cVar9 = cVar9 + '\x01';
  }
LAB_00185746:
  __str.field_2._8_8_ = local_78;
  std::__cxx11::string::_M_construct((ulong)((long)&__str.field_2 + 8),cVar9);
  std::__detail::__to_chars_10_impl<unsigned_int>((char *)__str.field_2._8_8_,local_80,uVar26);
  __l._M_len = 2;
  __l._M_array = (iterator)auStack_a8;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_108,__l,(allocator_type *)&local_128);
  ParserContext::errorAtToken
            ((ParserContext *)local_e8,Error,pTVar10,&local_58,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_108);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_108);
  lVar30 = 0;
  do {
    puVar5 = *(undefined1 **)((long)&__str.field_2 + lVar30 + 8);
    if (local_78 + lVar30 != puVar5) {
      operator_delete(puVar5);
    }
    lVar30 = lVar30 + -0x20;
  } while (lVar30 != -0x40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p);
  }
  psVar31 = outNodes.
            super__Vector_base<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  auVar19 = auStack_c8;
  auVar33 = auStack_c8;
  if ((undefined1  [8])
      outNodes.
      super__Vector_base<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
      ._M_impl.super__Vector_impl_data._M_start != auStack_c8) {
    do {
      this_00 = (((shared_ptr<chatra::Node> *)auVar33)->
                super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
      if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
      }
      auVar33 = (undefined1  [8])((long)auVar33 + 0x10);
    } while (auVar33 != (undefined1  [8])psVar31);
    outNodes.
    super__Vector_base<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)auVar19;
  }
LAB_00185820:
  cVar17 = std::
           _Hashtable<chatra::NodeType,_chatra::NodeType,_std::allocator<chatra::NodeType>,_std::__detail::_Identity,_std::equal_to<chatra::NodeType>,_std::hash<chatra::NodeType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
           ::find((_Hashtable<chatra::NodeType,_chatra::NodeType,_std::allocator<chatra::NodeType>,_std::__detail::_Identity,_std::equal_to<chatra::NodeType>,_std::hash<chatra::NodeType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                   *)runnableContainerNodeTypes,&local_38->type);
  psVar31 = outNodes.
            super__Vector_base<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  auVar19 = auStack_c8;
  if (cVar17.super__Node_iterator_base<chatra::NodeType,_false>._M_cur != (__node_type *)0x0) {
    for (; auVar19 != (undefined1  [8])psVar31; auVar19 = (undefined1  [8])((long)auVar19 + 0x10)) {
      cVar17 = std::
               _Hashtable<chatra::NodeType,_chatra::NodeType,_std::allocator<chatra::NodeType>,_std::__detail::_Identity,_std::equal_to<chatra::NodeType>,_std::hash<chatra::NodeType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
               ::find((_Hashtable<chatra::NodeType,_chatra::NodeType,_std::allocator<chatra::NodeType>,_std::__detail::_Identity,_std::equal_to<chatra::NodeType>,_std::hash<chatra::NodeType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                       *)runnableNodeTypes,
                      &((((shared_ptr<chatra::Node> *)auVar19)->
                        super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->type)
      ;
      if (cVar17.super__Node_iterator_base<chatra::NodeType,_false>._M_cur != (__node_type *)0x0)
      goto LAB_00185901;
    }
    auStack_a8 = (undefined1  [8])&__str._M_string_length;
    std::__cxx11::string::_M_construct<char_const*>((string *)auStack_a8,"empty block statement","")
    ;
    local_58._M_dataplus._M_p = (pointer)0x0;
    local_58._M_string_length = 0;
    local_58.field_2._M_allocated_capacity = 0;
    peVar2 = (local_38->line).super___shared_ptr<chatra::Line,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    (**(code **)(*(long *)ct.ws + 0x10))
              (ct.ws,1,&peVar2->fileName,peVar2->lineNo,&peVar2->line,0xffffffffffffffff,
               0xffffffffffffffff,(string *)auStack_a8,&local_58);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&local_58);
    if (auStack_a8 != (undefined1  [8])&__str._M_string_length) {
      operator_delete((void *)auStack_a8);
    }
  }
LAB_00185901:
  if (auStack_c8 !=
      (undefined1  [8])
      outNodes.
      super__Vector_base<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    bVar29 = false;
    bVar25 = false;
    bVar34 = false;
    psVar20 = outNodes.
              super__Vector_base<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    iVar18._M_current = (shared_ptr<chatra::Node> *)auStack_c8;
    do {
      peVar3 = ((iVar18._M_current)->super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>).
               _M_ptr;
      if (bVar25) {
        auStack_a8 = (undefined1  [8])&__str._M_string_length;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)auStack_a8,"nothing can be placed after \"finally\" block","");
        local_58._M_dataplus._M_p = (pointer)0x0;
        local_58._M_string_length = 0;
        local_58.field_2._M_allocated_capacity = 0;
        peVar2 = (peVar3->line).super___shared_ptr<chatra::Line,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        (**(code **)(*(long *)ct.ws + 0x10))
                  (ct.ws,2,&peVar2->fileName,peVar2->lineNo,&peVar2->line,0xffffffffffffffff,
                   0xffffffffffffffff,(string *)auStack_a8,&local_58);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&local_58);
        if (auStack_a8 != (undefined1  [8])&__str._M_string_length) {
LAB_00185bbb:
          operator_delete((void *)auStack_a8);
        }
LAB_00185bc0:
        std::vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
        ::_M_erase((vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
                    *)auStack_c8,iVar18,
                   (iterator)
                   outNodes.
                   super__Vector_base<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
                   ._M_impl.super__Vector_impl_data._M_start);
        break;
      }
      NVar21 = peVar3->type;
      if (NVar21 == Catch) {
        bVar25 = false;
LAB_0018594a:
        bVar29 = true;
      }
      else {
        if (NVar21 == Finally) {
          bVar25 = true;
          goto LAB_0018594a;
        }
        if (bVar34) {
          auStack_a8 = (undefined1  [8])&__str._M_string_length;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)auStack_a8,"unreachable code","");
          local_58._M_dataplus._M_p = (pointer)0x0;
          local_58._M_string_length = 0;
          local_58.field_2._M_allocated_capacity = 0;
          peVar2 = (peVar3->line).super___shared_ptr<chatra::Line,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr;
          (**(code **)(*(long *)ct.ws + 0x10))
                    (ct.ws,1,&peVar2->fileName,peVar2->lineNo,&peVar2->line,0xffffffffffffffff,
                     0xffffffffffffffff,(string *)auStack_a8,&local_58);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&local_58);
          if (auStack_a8 != (undefined1  [8])&__str._M_string_length) {
            operator_delete((void *)auStack_a8);
          }
          uVar28 = (long)outNodes.
                         super__Vector_base<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
                         ._M_impl.super__Vector_impl_data._M_start - (long)iVar18._M_current;
          iVar24._M_current = iVar18._M_current;
          if (0 < (long)uVar28 >> 6) {
            iVar24._M_current =
                 (shared_ptr<chatra::Node> *)
                 ((long)&((iVar18._M_current)->
                         super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>)._M_ptr +
                 (uVar28 & 0xffffffffffffffc0));
            lVar30 = ((long)uVar28 >> 6) + 1;
            __last._M_current = iVar18._M_current + 2;
            do {
              if (((__last._M_current[-2].
                    super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->type &
                  ~ScriptRoot) == Catch) {
                __last._M_current = __last._M_current + -2;
                goto LAB_00185b01;
              }
              if (((__last._M_current[-1].
                    super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->type &
                  ~ScriptRoot) == Catch) {
                __last._M_current = __last._M_current + -1;
                goto LAB_00185b01;
              }
              if (((((__last._M_current)->
                    super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->type &
                  ~ScriptRoot) == Catch) goto LAB_00185b01;
              if (((__last._M_current[1].
                    super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->type &
                  ~ScriptRoot) == Catch) {
                __last._M_current = __last._M_current + 1;
                goto LAB_00185b01;
              }
              lVar30 = lVar30 + -1;
              __last._M_current = __last._M_current + 4;
            } while (1 < lVar30);
            uVar28 = (long)outNodes.
                           super__Vector_base<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
                           ._M_impl.super__Vector_impl_data._M_start - (long)iVar24._M_current;
          }
          lVar30 = (long)uVar28 >> 4;
          if (lVar30 == 1) {
LAB_00185aef:
            __last._M_current =
                 outNodes.
                 super__Vector_base<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
            if (((((iVar24._M_current)->super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>
                  )._M_ptr)->type & ~ScriptRoot) == Catch) {
              __last._M_current = iVar24._M_current;
            }
          }
          else if (lVar30 == 2) {
LAB_00185ac7:
            __last._M_current = iVar24._M_current;
            if (((((iVar24._M_current)->super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>
                  )._M_ptr)->type & ~ScriptRoot) != Catch) {
              iVar24._M_current = iVar24._M_current + 1;
              goto LAB_00185aef;
            }
          }
          else {
            __last._M_current =
                 outNodes.
                 super__Vector_base<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
            if ((lVar30 == 3) &&
               (__last._M_current = iVar24._M_current,
               ((((iVar24._M_current)->super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>)
                ._M_ptr)->type & ~ScriptRoot) != Catch)) {
              iVar24._M_current = iVar24._M_current + 1;
              goto LAB_00185ac7;
            }
          }
LAB_00185b01:
          iVar18 = std::
                   vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
                   ::_M_erase((vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
                               *)auStack_c8,iVar18,__last);
          if (iVar18._M_current ==
              outNodes.
              super__Vector_base<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
              ._M_impl.super__Vector_impl_data._M_start) break;
          iVar18._M_current = iVar18._M_current + -1;
          bVar34 = true;
          bVar25 = false;
          psVar20 = outNodes.
                    super__Vector_base<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
        }
        else {
          bVar34 = (byte)(NVar21 - Break) < 4;
          if (bVar29) {
            auStack_a8 = (undefined1  [8])&__str._M_string_length;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)auStack_a8,"expected \"catch\" or \"finally\"","");
            local_58._M_dataplus._M_p = (pointer)0x0;
            local_58._M_string_length = 0;
            local_58.field_2._M_allocated_capacity = 0;
            peVar2 = (peVar3->line).super___shared_ptr<chatra::Line,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr;
            (**(code **)(*(long *)ct.ws + 0x10))
                      (ct.ws,2,&peVar2->fileName,peVar2->lineNo,&peVar2->line,0xffffffffffffffff,
                       0xffffffffffffffff,(string *)auStack_a8,&local_58);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&local_58);
            if (auStack_a8 != (undefined1  [8])&__str._M_string_length) goto LAB_00185bbb;
            goto LAB_00185bc0;
          }
          bVar25 = false;
          bVar29 = false;
        }
      }
      iVar18._M_current = iVar18._M_current + 1;
    } while (iVar18._M_current != psVar20);
  }
  if ((local_38->type == Switch) &&
     (auStack_c8 !=
      (undefined1  [8])
      outNodes.
      super__Vector_base<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
      ._M_impl.super__Vector_impl_data._M_start)) {
    lVar30 = -(long)auStack_c8;
    bVar34 = false;
    auVar19 = auStack_c8;
    do {
      peVar3 = (((shared_ptr<chatra::Node> *)auVar19)->
               super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      NVar21 = peVar3->type;
      if (NVar21 == Default) {
        bVar34 = true;
      }
      else if (NVar21 == Case) {
        if (bVar34) {
          auStack_a8 = (undefined1  [8])&__str._M_string_length;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)auStack_a8,"\"case\" cannot be placed after \"default\"","");
          local_58._M_dataplus._M_p = (pointer)0x0;
          local_58._M_string_length = 0;
          local_58.field_2._M_allocated_capacity = 0;
          peVar2 = (peVar3->line).super___shared_ptr<chatra::Line,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr;
          (**(code **)(*(long *)ct.ws + 0x10))
                    (ct.ws,2,&peVar2->fileName,peVar2->lineNo,&peVar2->line,0xffffffffffffffff,
                     0xffffffffffffffff,(string *)auStack_a8,&local_58);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&local_58);
          if (auStack_a8 != (undefined1  [8])&__str._M_string_length) {
            operator_delete((void *)auStack_a8);
          }
          std::
          vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>::
          _M_erase((vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
                    *)auStack_c8,(shared_ptr<chatra::Node> *)-lVar30,
                   (iterator)
                   outNodes.
                   super__Vector_base<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
                   ._M_impl.super__Vector_impl_data._M_start);
          break;
        }
        bVar34 = false;
      }
      auVar19 = (undefined1  [8])((long)auVar19 + 0x10);
      lVar30 = lVar30 + -0x10;
    } while (auVar19 !=
             (undefined1  [8])
             outNodes.
             super__Vector_base<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
             ._M_impl.super__Vector_impl_data._M_start);
  }
  this = &local_38->blockNodes;
  std::vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>::clear
            (this);
  psVar31 = outNodes.
            super__Vector_base<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (auStack_c8 !=
      (undefined1  [8])
      outNodes.
      super__Vector_base<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    auVar19 = auStack_c8;
    do {
      pNVar6 = (((value_type *)auVar19)->
               super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      NVar21 = pNVar6->type;
      if (NVar21 - 0xc < 2) {
        psVar7 = (local_38->blockNodes).
                 super__Vector_base<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        if (((local_38->blockNodes).
             super__Vector_base<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
             ._M_impl.super__Vector_impl_data._M_start == psVar7) ||
           (peVar3 = psVar7[-1].super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
           peVar3->type != IfGroup)) {
          auStack_a8 = (undefined1  [8])&__str._M_string_length;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)auStack_a8,"unexpected \"else\" statement","");
          local_58._M_dataplus._M_p = (pointer)0x0;
          local_58._M_string_length = 0;
          local_58.field_2._M_allocated_capacity = 0;
          peVar2 = (pNVar6->line).super___shared_ptr<chatra::Line,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr;
          (**(code **)(*(long *)ct.ws + 0x10))
                    (ct.ws,2,&peVar2->fileName,peVar2->lineNo,&peVar2->line,0xffffffffffffffff,
                     0xffffffffffffffff,(string *)auStack_a8,&local_58);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&local_58);
          if (auStack_a8 != (undefined1  [8])&__str._M_string_length) {
LAB_00185e9d:
            operator_delete((void *)auStack_a8);
          }
        }
        else if (((peVar3->blockNodes).
                  super__Vector_base<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish[-1].
                  super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->type == Else
                ) {
          auStack_a8 = (undefined1  [8])&__str._M_string_length;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)auStack_a8,"extra \"else\" statement","");
          local_58._M_dataplus._M_p = (pointer)0x0;
          local_58._M_string_length = 0;
          local_58.field_2._M_allocated_capacity = 0;
          peVar2 = (pNVar6->line).super___shared_ptr<chatra::Line,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr;
          (**(code **)(*(long *)ct.ws + 0x10))
                    (ct.ws,2,&peVar2->fileName,peVar2->lineNo,&peVar2->line,0xffffffffffffffff,
                     0xffffffffffffffff,(string *)auStack_a8,&local_58);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&local_58);
          if (auStack_a8 != (undefined1  [8])&__str._M_string_length) goto LAB_00185e9d;
        }
        else {
          std::
          vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>::
          push_back(&peVar3->blockNodes,(value_type *)auVar19);
        }
      }
      else if (NVar21 == If) {
        auStack_a8 = (undefined1  [8])0x0;
        __str._M_dataplus._M_p = (pointer)0x0;
        psVar20 = addNode<std::vector<std::shared_ptr<chatra::Node>,std::allocator<std::shared_ptr<chatra::Node>>>>
                            (this,(shared_ptr<chatra::Line> *)auStack_a8,IfGroup);
        if (__str._M_dataplus._M_p != (pointer)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)__str._M_dataplus._M_p);
        }
        std::vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
        ::push_back(&((psVar20->super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
                     )->blockNodes,(value_type *)auVar19);
        LOCK();
        (((psVar20->super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
        blockNodesState)._M_i = Structured;
        UNLOCK();
      }
      else {
        if ((NVar21 == Sync) && (ct.sTable._4_1_ == '\0')) {
          structureInnerNode(errorReceiver,sTable,pNVar6,false);
        }
        std::vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
        ::push_back(this,(value_type *)auVar19);
      }
      auVar19 = (undefined1  [8])((long)auVar19 + 0x10);
    } while (auVar19 != (undefined1  [8])psVar31);
  }
  if (ct.sTable._4_1_ != '\0') {
    psVar7 = (local_38->blockNodes).
             super__Vector_base<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (psVar31 = (local_38->blockNodes).
                   super__Vector_base<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
                   ._M_impl.super__Vector_impl_data._M_start; psVar31 != psVar7;
        psVar31 = psVar31 + 1) {
      recursiveStructureNodes
                (errorReceiver,sTable,
                 (psVar31->super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>)._M_ptr);
    }
  }
  LOCK();
  (local_38->blockNodesState)._M_i = Structured;
  UNLOCK();
  std::vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>::
  ~vector((vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_> *)
          auStack_c8);
  return;
}

Assistant:

void structureInnerNode(IErrorReceiver& errorReceiver,
		std::shared_ptr<StringTable>& sTable, Node* node, bool recursive) {

	chatra_assert(node->blockNodes.empty() || node->blockNodesState == NodeState::Grouped);

	ParserContext ct(nullptr, errorReceiver, sTable);
	unsigned expectedIndents = (node->line ? node->line->indents + 1 : 0);

	std::vector<std::shared_ptr<Node>> outNodes;
	for (auto it = node->blockNodes.cbegin(); it != node->blockNodes.cend(); ) {
		auto& n = *it;

		if (n->line->indents != expectedIndents) {
			ct.errorAtToken(ErrorLevel::Error, n->line->tokens[0],
					"indent mismatch. Expected ${0} indents but ${1} indents found",
					{std::to_string(expectedIndents), std::to_string(n->line->indents)});
			outNodes.clear();
			break;
		}

		if (n->line->tokens[0].type == TokenType::Name) {
			// Look ahead 3 tokens to find "label : loop", "def operator" or "else if" pattern
			auto itForward = it;
			size_t tokenIndex = 0;

			auto token0 = nextTokenFromNodes(it, node->blockNodes.cend(), itForward, tokenIndex);
			auto token1 = nextTokenFromNodes(it, node->blockNodes.cend(), itForward, tokenIndex);
			auto token2 = nextTokenFromNodes(it, node->blockNodes.cend(), itForward, tokenIndex);

			auto keyToken = token0;
			StringId labelName = StringId::Invalid;
			if (token2 != nullptr && !lineTypes.count(token0->sid)
					&& matches(*token1, StringId::Colon) && matches(*token2, TokenType::Name)) {
				keyToken = token2;
				labelName = token0->sid;
			}

			auto itType = lineTypes.find(keyToken->sid);
			if (itType != lineTypes.end()) {
				auto const& attr = itType->second;
				it = combineWrappedLines(it, node->blockNodes.cend(), attr.hasBlock);

				if (token2 != nullptr && labelName != StringId::Invalid) {
					if (n->tokens.size() < 3 || token2 != n->tokens[2]) {
						ct.errorAtToken(ErrorLevel::Error, *token2, "this line seems to be part of wrapping line, but indents may be incorrect", {});
						// Skip few lines which is considered as part of wrapping line
						it = (itForward == node->blockNodes.cend() || tokenIndex == 0 ? itForward : itForward + 1);
						continue;
					}
					if (attr.type != NodeType::For && attr.type != NodeType::While) {
						ct.errorAtToken(ErrorLevel::Error, *token2, R"(only "for" or "while" can take label)", {});
						continue;
					}
					n->sid = labelName;
				}

				// Check whether sentence is correctly placed
				if (std::find(attr.parentType.cbegin(), attr.parentType.cend(), node->type) == attr.parentType.cend()) {
					ct.errorAtToken(ErrorLevel::Error, *keyToken,
							std::string("statement \"") + ct.getSt()->ref(keyToken->sid) + "\" is not allowed here", {});
					continue;
				}

				n->type = attr.type;
				if (n->type == NodeType::Def && token1 != nullptr && matches(*token1, StringId::Operator))
					n->type = NodeType::DefOperator;
				if (n->type == NodeType::Else && token1 != nullptr && matches(*token1, StringId::If))
					n->type = NodeType::ElseIf;

				if (attr.hasBlock) {
					for (; it != node->blockNodes.cend() && expectedIndents < (*it)->line->indents; it++)
						n->blockNodes.push_back(*it);
				}

				outNodes.push_back(n);
				continue;
			}
		}

		it = combineWrappedLines(it, node->blockNodes.cend(), false);

		if (std::find(expressionParentType.cbegin(), expressionParentType.cend(), node->type) == expressionParentType.cend()) {
			ct.errorAtLine(ErrorLevel::Error, n->line, "expression is not allowed here", {});
			continue;
		}

		n->type = NodeType::Expression;
		outNodes.push_back(n);
	}

	// Check empty block
	if (runnableContainerNodeTypes.count(node->type) != 0) {
		bool runnableNodeFound = false;
		for (auto& n : outNodes) {
			if (runnableNodeTypes.count(n->type) != 0) {
				runnableNodeFound = true;
				break;
			}
		}
		if (!runnableNodeFound)
			ct.errorAtLine(ErrorLevel::Warning, node->line, "empty block statement", {});
	}

	// Check order of Catch/Finally and unreachable code
	bool catchFinallyFound = false;
	bool finallyFound = false;
	bool left = false;
	for (auto it = outNodes.cbegin(); it != outNodes.cend(); it++) {
		auto& n = *it;
		if (finallyFound) {
			ct.errorAtLine(ErrorLevel::Error, n->line, "nothing can be placed after \"finally\" block", {});
			outNodes.erase(it, outNodes.cend());
			break;
		}

		if (n->type == NodeType::Catch)
			catchFinallyFound = true;
		else if (n->type == NodeType::Finally) {
			catchFinallyFound = true;
			finallyFound = true;
		}
		else {
			if (left) {
				ct.errorAtLine(ErrorLevel::Warning, n->line, "unreachable code", {});
				it = outNodes.erase(it, std::find_if(it, outNodes.cend(), [](const std::shared_ptr<Node>& n) {
					return n->type == NodeType::Catch || n->type == NodeType::Finally; }));
				if (it == outNodes.cend())
					break;
				it--;
				continue;
			}

			switch (n->type) {
			case NodeType::Break:
			case NodeType::Continue:
			case NodeType::Return:
			case NodeType::Throw:
				left = true;
				break;
			default:
				break;
			}

			if (catchFinallyFound) {
				ct.errorAtLine(ErrorLevel::Error, n->line, R"(expected "catch" or "finally")", {});
				outNodes.erase(it, outNodes.cend());
				break;
			}
		}
	}

	// Check order of Case/Default
	if (node->type == NodeType::Switch) {
		bool defaultFound = false;
		for (auto it = outNodes.cbegin(); it != outNodes.cend(); it++) {
			auto& n = *it;
			if (n->type == NodeType::Default)
				defaultFound = true;
			else if (n->type == NodeType::Case && defaultFound) {
				ct.errorAtLine(ErrorLevel::Error, n->line, R"("case" cannot be placed after "default")", {});
				outNodes.erase(it, outNodes.cend());
				break;
			}
		}
	}

	// Copy outNodes to node->blockNodes with grouping IfGroup
	node->blockNodes.clear();
	for (auto& n : outNodes) {
		switch (n->type) {
		case NodeType::Sync:
			if (!recursive)
				structureInnerNode(errorReceiver, sTable, n.get(), false);
			node->blockNodes.push_back(n);
			break;

		case NodeType::If: {
			auto& nGroup = addNode(node->blockNodes, nullptr, NodeType::IfGroup);
			nGroup->blockNodes.push_back(n);
			nGroup->blockNodesState = NodeState::Structured;
			break;
		}

		case NodeType::ElseIf:
		case NodeType::Else: {
			if (node->blockNodes.empty() || node->blockNodes.back()->type != NodeType::IfGroup) {
				ct.errorAtLine(ErrorLevel::Error, n->line, R"(unexpected "else" statement)", {});
				continue;
			}
			auto& nGroup = node->blockNodes.back();
			if (nGroup->blockNodes.back()->type == NodeType::Else) {
				ct.errorAtLine(ErrorLevel::Error, n->line, R"(extra "else" statement)", {});
				continue;
			}
			nGroup->blockNodes.push_back(n);
			break;
		}

		default:
			node->blockNodes.push_back(n);
			break;
		}
	}

	if (recursive) {
		for (auto& n : node->blockNodes)
			recursiveStructureNodes(errorReceiver, sTable, n.get());
	}

	node->blockNodesState = NodeState::Structured;
}